

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O2

err_t bignIdExtract(octet *id_privkey,octet *id_pubkey,bign_params *params,octet *oid_der,
                   size_t oid_len,octet *id_hash,octet *sig,octet *pubkey)

{
  u64 *dest;
  u64 *stack;
  ulong n;
  ulong count;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  ulong hash_len;
  u64 *dest_00;
  word *b;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      eVar2 = 0x12d;
      if ((oid_len != 0xffffffffffffffff) &&
         (sVar4 = oidFromDER((char *)0x0,oid_der,oid_len), sVar4 != 0xffffffffffffffff)) {
        sVar4 = bignStart_keep(params->l,bignIdExtract_deep);
        ec = (ec_o *)blobCreate(sVar4);
        if (ec == (ec_o *)0x0) {
          eVar2 = 0x6e;
        }
        else {
          eVar2 = bignStart(ec,params);
          if (eVar2 == 0) {
            n = ec->f->n;
            count = ec->f->no;
            bVar1 = memIsValid(id_hash,count);
            eVar2 = 0x6d;
            if (bVar1 != 0) {
              hash_len = count >> 1;
              bVar1 = memIsValid(sig,hash_len + count);
              if (bVar1 != 0) {
                bVar1 = memIsValid(pubkey,count * 2);
                if (((bVar1 != 0) && (bVar1 = memIsValid(id_privkey,count), bVar1 != 0)) &&
                   (bVar1 = memIsValid(id_pubkey,count * 2), bVar1 != 0)) {
                  b = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
                  dest_00 = b + n * 2;
                  dest = dest_00 + n;
                  stack = dest + n;
                  bVar1 = (*ec->f->from)(b,pubkey,ec->f,stack);
                  eVar2 = 0x1f9;
                  if (bVar1 != 0) {
                    bVar1 = (*ec->f->from)(b + n,pubkey + count,ec->f,stack);
                    if (bVar1 != 0) {
                      u64From(dest,sig + hash_len,count);
                      iVar3 = wwCmp(dest,ec->order,n);
                      eVar2 = 0x1fe;
                      if (iVar3 < 0) {
                        u64From(dest_00,id_hash,count);
                        iVar3 = wwCmp(dest_00,ec->order,n);
                        if (-1 < iVar3) {
                          zzSub2(dest_00,ec->order,n);
                        }
                        zzAddMod(dest,dest,dest_00,ec->order,n);
                        u64From(dest_00,sig,count);
                        dest_00[n >> 1] = 1;
                        bVar1 = ecAddMulA(b,ec,stack,2,ec->base,dest,n,b,dest_00,(n >> 1) + 1);
                        if (bVar1 != 0) {
                          (*ec->f->to)((octet *)b,b,ec->f,stack);
                          beltHashStart(stack);
                          beltHashStepH(oid_der,oid_len,stack);
                          beltHashStepH(b,count,stack);
                          beltHashStepH(id_hash,count,stack);
                          bVar1 = beltHashStepV2(sig,hash_len,stack);
                          if (bVar1 != 0) {
                            u64To(id_privkey,count,dest);
                            memCopy(id_pubkey,b,count);
                            (*ec->f->to)(id_pubkey + count,b + n,ec->f,stack);
                            eVar2 = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          blobClose(ec);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignIdExtract(octet id_privkey[], octet id_pubkey[], 
	const bign_params* params, const octet oid_der[], size_t oid_len,
	const octet id_hash[], const octet sig[], octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */
	word* Q;			/* [2n] открытый ключ */
	word* R;			/* [2n] точка R */
	word* H;			/* [n] хэш-значение */
	word* s0;			/* [n / 2 + 1] первая часть подписи */
	word* s1;			/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignIdExtract_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(id_hash, no) ||
		!memIsValid(sig, no + no / 2) ||
		!memIsValid(pubkey, 2 * no) ||
		!memIsValid(id_privkey, no) ||
		!memIsValid(id_pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = R = objEnd(ec, word);
	H = s0 = Q + 2 * n;
	s1 = H + n;
	stack = (octet*)(s1 + n);
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить и проверить s1
	wwFrom(s1, sig + no / 2, no);
	if (wwCmp(s1, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	// s1 <- (s1 + H) mod q
	wwFrom(H, id_hash, no);
	if (wwCmp(H, ec->order, n) >= 0)
	{
		zzSub2(H, ec->order, n);
		// 2^{l - 1} < q < 2^l, H < 2^l => H - q < q
		ASSERT(wwCmp(H, ec->order, n) < 0);
	}
	zzAddMod(s1, s1, H, ec->order, n);
	// загрузить s0
	wwFrom(s0, sig, no);
	s0[n / 2] = 1;
	// R <- s1 G + (s0 + 2^l) Q
	if (!ecAddMulA(R, ec, stack, 2, ec->base, s1, n, Q, s0, n / 2 + 1))
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 == belt-hash(oid || R || H) mod 2^l?
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, no, stack);
	beltHashStepH(id_hash, no, stack);
	if (beltHashStepV2(sig, no / 2, stack))
	{
		wwTo(id_privkey, no, s1);
		memCopy(id_pubkey, R, no);
		qrTo(id_pubkey + no, ecY(R, n), ec->f, stack);
	}
	else
		code = ERR_BAD_SIG;
	// завершение
	blobClose(state);
	return code;
}